

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_do_assert_not_mapped(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  void *pvVar3;
  rtree_leaf_elm_t *prVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t *rtree_ctx_00;
  ulong uVar11;
  bool bVar12;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_1a8;
  
  rtree_ctx_00 = &rStack_1a8;
  rtree_ctx = &rStack_1a8;
  pvVar3 = edata->e_addr;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_1a8);
  }
  else {
    rtree_ctx_00 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar5 = (ulong)pvVar3 & 0xffffffffc0000000;
  uVar11 = (ulong)(((uint)((ulong)pvVar3 >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&rtree_ctx_00->cache[0].leafkey + uVar11);
  uVar11 = *(ulong *)((long)&rtree_ctx_00->cache[0].leafkey + uVar11);
  if (uVar11 != uVar5) {
    if (rtree_ctx_00->l2_cache[0].leafkey == uVar5) {
      prVar4 = rtree_ctx_00->l2_cache[0].leaf;
      rtree_ctx_00->l2_cache[0].leafkey = uVar11;
      rtree_ctx_00->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar5;
      puVar2[1] = (ulong)prVar4;
    }
    else {
      prVar9 = rtree_ctx_00->l2_cache + 1;
      if (rtree_ctx_00->l2_cache[1].leafkey == uVar5) {
        uVar7 = 0;
        bVar12 = false;
      }
      else {
        uVar6 = 1;
        prVar10 = prVar9;
        do {
          uVar7 = uVar6;
          bVar12 = 6 < uVar7;
          if (uVar7 == 7) goto LAB_01dad34d;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar6 = uVar7 + 1;
          prVar10 = prVar9;
        } while (prVar1->leafkey != uVar5);
        bVar12 = 6 < uVar7;
      }
      prVar4 = prVar9->leaf;
      prVar9->leafkey = rtree_ctx_00->l2_cache[uVar7].leafkey;
      prVar9->leaf = rtree_ctx_00->l2_cache[uVar7].leaf;
      rtree_ctx_00->l2_cache[uVar7].leafkey = uVar11;
      rtree_ctx_00->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar5;
      puVar2[1] = (ulong)prVar4;
LAB_01dad34d:
      if (bVar12) {
        duckdb_je_rtree_leaf_elm_lookup_hard
                  (tsdn,&emap->rtree,rtree_ctx_00,(ulong)pvVar3 & 0xfffffffffffff000,false,false);
      }
    }
  }
  uVar11 = (((edata->field_2).e_size_esn & 0xfffffffffffff000) +
           ((ulong)edata->e_addr & 0xfffffffffffff000)) - 0x1000;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_1a8);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar6 = uVar11 & 0xffffffffc0000000;
  uVar5 = (ulong)(((uint)(uVar11 >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  uVar5 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  if (uVar5 != uVar6) {
    if (rtree_ctx->l2_cache[0].leafkey == uVar6) {
      prVar4 = rtree_ctx->l2_cache[0].leaf;
      rtree_ctx->l2_cache[0].leafkey = uVar5;
      rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar6;
      puVar2[1] = (ulong)prVar4;
    }
    else {
      prVar9 = rtree_ctx->l2_cache + 1;
      if (rtree_ctx->l2_cache[1].leafkey == uVar6) {
        uVar8 = 0;
        bVar12 = false;
      }
      else {
        uVar7 = 1;
        prVar10 = prVar9;
        do {
          uVar8 = uVar7;
          bVar12 = 6 < uVar8;
          if (uVar8 == 7) goto LAB_01dad3cf;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar7 = uVar8 + 1;
          prVar10 = prVar9;
        } while (prVar1->leafkey != uVar6);
        bVar12 = 6 < uVar8;
      }
      prVar4 = prVar9->leaf;
      prVar9->leafkey = rtree_ctx->l2_cache[uVar8].leafkey;
      prVar9->leaf = rtree_ctx->l2_cache[uVar8].leaf;
      rtree_ctx->l2_cache[uVar8].leafkey = uVar5;
      rtree_ctx->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar6;
      puVar2[1] = (ulong)prVar4;
LAB_01dad3cf:
      if (bVar12) {
        duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,rtree_ctx,uVar11,false,false);
      }
    }
  }
  return;
}

Assistant:

void
emap_do_assert_not_mapped(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	emap_full_alloc_ctx_t context1 = {0};
	emap_full_alloc_ctx_try_lookup(tsdn, emap, edata_base_get(edata),
	    &context1);
	assert(context1.edata == NULL);

	emap_full_alloc_ctx_t context2 = {0};
	emap_full_alloc_ctx_try_lookup(tsdn, emap, edata_last_get(edata),
	    &context2);
	assert(context2.edata == NULL);
}